

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

bool __thiscall QVariant::view(QVariant *this,int type,void *ptr)

{
  long lVar1;
  QMetaType fromType;
  bool bVar2;
  QMetaType *this_00;
  void *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_00000028;
  int typeId;
  QVariant *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  
  typeId = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Private::type(&in_stack_ffffffffffffffc0->d);
  this_00 = (QMetaType *)data(in_stack_ffffffffffffffc0);
  QMetaType::QMetaType(this_00,typeId);
  fromType.d_ptr._4_4_ = type;
  fromType.d_ptr._0_4_ = in_stack_00000028;
  bVar2 = QMetaType::view(fromType,(void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),(QMetaType)ptr
                          ,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QVariant::view(int type, void *ptr)
{
    return QMetaType::view(d.type(), data(), QMetaType(type), ptr);
}